

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hive_partitioning.cpp
# Opt level: O2

void duckdb::GetHivePartitionValuesTypeSwitch
               (Vector *input,vector<duckdb::HivePartitionKey,_true> *keys,idx_t col_idx,idx_t count
               )

{
  LogicalType *rhs;
  PhysicalType PVar1;
  bool bVar2;
  reference this;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  Value *pVVar6;
  InternalException *this_00;
  idx_t i_1;
  idx_t i;
  size_type sVar7;
  string_t value;
  interval_t value_00;
  uhugeint_t value_01;
  hugeint_t value_02;
  Value result;
  UnifiedVectorFormat format;
  LogicalType local_48;
  
  rhs = &input->type;
  PVar1 = (input->type).physical_type_;
  switch(PVar1) {
  case BOOL:
    UnifiedVectorFormat::UnifiedVectorFormat(&format);
    Vector::ToUnifiedFormat(input,count,&format);
    if ((format.sel)->sel_vector == (uint *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (ulong)*(format.sel)->sel_vector;
    }
    Value::CreateValue<bool>(&result,(bool)format.data[uVar3]);
    bVar2 = LogicalType::operator!=(&result.type_,rhs);
    Value::~Value(&result);
    if (bVar2) {
      for (sVar7 = 0; count != sVar7; sVar7 = sVar7 + 1) {
        pvVar5 = vector<duckdb::HivePartitionKey,_true>::get<true>(keys,sVar7);
        sVar4 = sVar7;
        if ((format.sel)->sel_vector != (sel_t *)0x0) {
          sVar4 = (size_type)(format.sel)->sel_vector[sVar7];
        }
        if ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[sVar4 >> 6] >>
             (sVar4 & 0x3f) & 1) != 0)) {
          GetHiveKeyValue<bool>(&result,(bool *)(format.data + sVar4));
          LogicalType::LogicalType(&local_48,rhs);
          Value::Reinterpret(&result,&local_48);
          LogicalType::~LogicalType(&local_48);
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        else {
          GetHiveKeyNullValue(&result,rhs);
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        Value::operator=(pVVar6,&result);
        Value::~Value(&result);
      }
    }
    else {
      for (sVar7 = 0; count != sVar7; sVar7 = sVar7 + 1) {
        pvVar5 = vector<duckdb::HivePartitionKey,_true>::get<true>(keys,sVar7);
        sVar4 = sVar7;
        if ((format.sel)->sel_vector != (sel_t *)0x0) {
          sVar4 = (size_type)(format.sel)->sel_vector[sVar7];
        }
        if ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[sVar4 >> 6] >>
             (sVar4 & 0x3f) & 1) != 0)) {
          GetHiveKeyValue<bool>(&result,(bool *)(format.data + sVar4));
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        else {
          GetHiveKeyNullValue(&result,rhs);
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        Value::operator=(pVVar6,&result);
        Value::~Value(&result);
      }
    }
    break;
  case UINT8:
    UnifiedVectorFormat::UnifiedVectorFormat(&format);
    Vector::ToUnifiedFormat(input,count,&format);
    if ((format.sel)->sel_vector == (uint *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (ulong)*(format.sel)->sel_vector;
    }
    Value::CreateValue<unsigned_char>(&result,format.data[uVar3]);
    bVar2 = LogicalType::operator!=(&result.type_,rhs);
    Value::~Value(&result);
    if (bVar2) {
      for (sVar7 = 0; count != sVar7; sVar7 = sVar7 + 1) {
        pvVar5 = vector<duckdb::HivePartitionKey,_true>::get<true>(keys,sVar7);
        sVar4 = sVar7;
        if ((format.sel)->sel_vector != (sel_t *)0x0) {
          sVar4 = (size_type)(format.sel)->sel_vector[sVar7];
        }
        if ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[sVar4 >> 6] >>
             (sVar4 & 0x3f) & 1) != 0)) {
          GetHiveKeyValue<unsigned_char>(&result,format.data + sVar4);
          LogicalType::LogicalType(&local_48,rhs);
          Value::Reinterpret(&result,&local_48);
          LogicalType::~LogicalType(&local_48);
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        else {
          GetHiveKeyNullValue(&result,rhs);
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        Value::operator=(pVVar6,&result);
        Value::~Value(&result);
      }
    }
    else {
      for (sVar7 = 0; count != sVar7; sVar7 = sVar7 + 1) {
        pvVar5 = vector<duckdb::HivePartitionKey,_true>::get<true>(keys,sVar7);
        sVar4 = sVar7;
        if ((format.sel)->sel_vector != (sel_t *)0x0) {
          sVar4 = (size_type)(format.sel)->sel_vector[sVar7];
        }
        if ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[sVar4 >> 6] >>
             (sVar4 & 0x3f) & 1) != 0)) {
          GetHiveKeyValue<unsigned_char>(&result,format.data + sVar4);
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        else {
          GetHiveKeyNullValue(&result,rhs);
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        Value::operator=(pVVar6,&result);
        Value::~Value(&result);
      }
    }
    break;
  case INT8:
    UnifiedVectorFormat::UnifiedVectorFormat(&format);
    Vector::ToUnifiedFormat(input,count,&format);
    if ((format.sel)->sel_vector == (uint *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (ulong)*(format.sel)->sel_vector;
    }
    Value::CreateValue<signed_char>(&result,format.data[uVar3]);
    bVar2 = LogicalType::operator!=(&result.type_,rhs);
    Value::~Value(&result);
    if (bVar2) {
      for (sVar7 = 0; count != sVar7; sVar7 = sVar7 + 1) {
        pvVar5 = vector<duckdb::HivePartitionKey,_true>::get<true>(keys,sVar7);
        sVar4 = sVar7;
        if ((format.sel)->sel_vector != (sel_t *)0x0) {
          sVar4 = (size_type)(format.sel)->sel_vector[sVar7];
        }
        if ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[sVar4 >> 6] >>
             (sVar4 & 0x3f) & 1) != 0)) {
          GetHiveKeyValue<signed_char>(&result,(char *)(format.data + sVar4));
          LogicalType::LogicalType(&local_48,rhs);
          Value::Reinterpret(&result,&local_48);
          LogicalType::~LogicalType(&local_48);
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        else {
          GetHiveKeyNullValue(&result,rhs);
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        Value::operator=(pVVar6,&result);
        Value::~Value(&result);
      }
    }
    else {
      for (sVar7 = 0; count != sVar7; sVar7 = sVar7 + 1) {
        pvVar5 = vector<duckdb::HivePartitionKey,_true>::get<true>(keys,sVar7);
        sVar4 = sVar7;
        if ((format.sel)->sel_vector != (sel_t *)0x0) {
          sVar4 = (size_type)(format.sel)->sel_vector[sVar7];
        }
        if ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[sVar4 >> 6] >>
             (sVar4 & 0x3f) & 1) != 0)) {
          GetHiveKeyValue<signed_char>(&result,(char *)(format.data + sVar4));
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        else {
          GetHiveKeyNullValue(&result,rhs);
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        Value::operator=(pVVar6,&result);
        Value::~Value(&result);
      }
    }
    break;
  case UINT16:
    UnifiedVectorFormat::UnifiedVectorFormat(&format);
    Vector::ToUnifiedFormat(input,count,&format);
    if ((format.sel)->sel_vector == (uint *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (ulong)*(format.sel)->sel_vector;
    }
    Value::CreateValue<unsigned_short>(&result,*(uint16_t *)(format.data + uVar3 * 2));
    bVar2 = LogicalType::operator!=(&result.type_,rhs);
    Value::~Value(&result);
    if (bVar2) {
      for (sVar7 = 0; count != sVar7; sVar7 = sVar7 + 1) {
        pvVar5 = vector<duckdb::HivePartitionKey,_true>::get<true>(keys,sVar7);
        sVar4 = sVar7;
        if ((format.sel)->sel_vector != (sel_t *)0x0) {
          sVar4 = (size_type)(format.sel)->sel_vector[sVar7];
        }
        if ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[sVar4 >> 6] >>
             (sVar4 & 0x3f) & 1) != 0)) {
          GetHiveKeyValue<unsigned_short>(&result,(unsigned_short *)(format.data + sVar4 * 2));
          LogicalType::LogicalType(&local_48,rhs);
          Value::Reinterpret(&result,&local_48);
          LogicalType::~LogicalType(&local_48);
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        else {
          GetHiveKeyNullValue(&result,rhs);
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        Value::operator=(pVVar6,&result);
        Value::~Value(&result);
      }
    }
    else {
      for (sVar7 = 0; count != sVar7; sVar7 = sVar7 + 1) {
        pvVar5 = vector<duckdb::HivePartitionKey,_true>::get<true>(keys,sVar7);
        sVar4 = sVar7;
        if ((format.sel)->sel_vector != (sel_t *)0x0) {
          sVar4 = (size_type)(format.sel)->sel_vector[sVar7];
        }
        if ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[sVar4 >> 6] >>
             (sVar4 & 0x3f) & 1) != 0)) {
          GetHiveKeyValue<unsigned_short>(&result,(unsigned_short *)(format.data + sVar4 * 2));
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        else {
          GetHiveKeyNullValue(&result,rhs);
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        Value::operator=(pVVar6,&result);
        Value::~Value(&result);
      }
    }
    break;
  case INT16:
    UnifiedVectorFormat::UnifiedVectorFormat(&format);
    Vector::ToUnifiedFormat(input,count,&format);
    if ((format.sel)->sel_vector == (uint *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (ulong)*(format.sel)->sel_vector;
    }
    Value::CreateValue<short>(&result,*(int16_t *)(format.data + uVar3 * 2));
    bVar2 = LogicalType::operator!=(&result.type_,rhs);
    Value::~Value(&result);
    if (bVar2) {
      for (sVar7 = 0; count != sVar7; sVar7 = sVar7 + 1) {
        pvVar5 = vector<duckdb::HivePartitionKey,_true>::get<true>(keys,sVar7);
        sVar4 = sVar7;
        if ((format.sel)->sel_vector != (sel_t *)0x0) {
          sVar4 = (size_type)(format.sel)->sel_vector[sVar7];
        }
        if ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[sVar4 >> 6] >>
             (sVar4 & 0x3f) & 1) != 0)) {
          GetHiveKeyValue<short>(&result,(short *)(format.data + sVar4 * 2));
          LogicalType::LogicalType(&local_48,rhs);
          Value::Reinterpret(&result,&local_48);
          LogicalType::~LogicalType(&local_48);
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        else {
          GetHiveKeyNullValue(&result,rhs);
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        Value::operator=(pVVar6,&result);
        Value::~Value(&result);
      }
    }
    else {
      for (sVar7 = 0; count != sVar7; sVar7 = sVar7 + 1) {
        pvVar5 = vector<duckdb::HivePartitionKey,_true>::get<true>(keys,sVar7);
        sVar4 = sVar7;
        if ((format.sel)->sel_vector != (sel_t *)0x0) {
          sVar4 = (size_type)(format.sel)->sel_vector[sVar7];
        }
        if ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[sVar4 >> 6] >>
             (sVar4 & 0x3f) & 1) != 0)) {
          GetHiveKeyValue<short>(&result,(short *)(format.data + sVar4 * 2));
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        else {
          GetHiveKeyNullValue(&result,rhs);
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        Value::operator=(pVVar6,&result);
        Value::~Value(&result);
      }
    }
    break;
  case UINT32:
    UnifiedVectorFormat::UnifiedVectorFormat(&format);
    Vector::ToUnifiedFormat(input,count,&format);
    if ((format.sel)->sel_vector == (uint *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (ulong)*(format.sel)->sel_vector;
    }
    Value::CreateValue<unsigned_int>(&result,*(uint32_t *)(format.data + uVar3 * 4));
    bVar2 = LogicalType::operator!=(&result.type_,rhs);
    Value::~Value(&result);
    if (bVar2) {
      for (sVar7 = 0; count != sVar7; sVar7 = sVar7 + 1) {
        pvVar5 = vector<duckdb::HivePartitionKey,_true>::get<true>(keys,sVar7);
        sVar4 = sVar7;
        if ((format.sel)->sel_vector != (sel_t *)0x0) {
          sVar4 = (size_type)(format.sel)->sel_vector[sVar7];
        }
        if ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[sVar4 >> 6] >>
             (sVar4 & 0x3f) & 1) != 0)) {
          GetHiveKeyValue<unsigned_int>(&result,(uint *)(format.data + sVar4 * 4));
          LogicalType::LogicalType(&local_48,rhs);
          Value::Reinterpret(&result,&local_48);
          LogicalType::~LogicalType(&local_48);
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        else {
          GetHiveKeyNullValue(&result,rhs);
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        Value::operator=(pVVar6,&result);
        Value::~Value(&result);
      }
    }
    else {
      for (sVar7 = 0; count != sVar7; sVar7 = sVar7 + 1) {
        pvVar5 = vector<duckdb::HivePartitionKey,_true>::get<true>(keys,sVar7);
        sVar4 = sVar7;
        if ((format.sel)->sel_vector != (sel_t *)0x0) {
          sVar4 = (size_type)(format.sel)->sel_vector[sVar7];
        }
        if ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[sVar4 >> 6] >>
             (sVar4 & 0x3f) & 1) != 0)) {
          GetHiveKeyValue<unsigned_int>(&result,(uint *)(format.data + sVar4 * 4));
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        else {
          GetHiveKeyNullValue(&result,rhs);
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        Value::operator=(pVVar6,&result);
        Value::~Value(&result);
      }
    }
    break;
  case INT32:
    UnifiedVectorFormat::UnifiedVectorFormat(&format);
    Vector::ToUnifiedFormat(input,count,&format);
    if ((format.sel)->sel_vector == (uint *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (ulong)*(format.sel)->sel_vector;
    }
    Value::CreateValue<int>(&result,*(int32_t *)(format.data + uVar3 * 4));
    bVar2 = LogicalType::operator!=(&result.type_,rhs);
    Value::~Value(&result);
    if (bVar2) {
      for (sVar7 = 0; count != sVar7; sVar7 = sVar7 + 1) {
        pvVar5 = vector<duckdb::HivePartitionKey,_true>::get<true>(keys,sVar7);
        sVar4 = sVar7;
        if ((format.sel)->sel_vector != (sel_t *)0x0) {
          sVar4 = (size_type)(format.sel)->sel_vector[sVar7];
        }
        if ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[sVar4 >> 6] >>
             (sVar4 & 0x3f) & 1) != 0)) {
          GetHiveKeyValue<int>(&result,(int *)(format.data + sVar4 * 4));
          LogicalType::LogicalType(&local_48,rhs);
          Value::Reinterpret(&result,&local_48);
          LogicalType::~LogicalType(&local_48);
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        else {
          GetHiveKeyNullValue(&result,rhs);
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        Value::operator=(pVVar6,&result);
        Value::~Value(&result);
      }
    }
    else {
      for (sVar7 = 0; count != sVar7; sVar7 = sVar7 + 1) {
        pvVar5 = vector<duckdb::HivePartitionKey,_true>::get<true>(keys,sVar7);
        sVar4 = sVar7;
        if ((format.sel)->sel_vector != (sel_t *)0x0) {
          sVar4 = (size_type)(format.sel)->sel_vector[sVar7];
        }
        if ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[sVar4 >> 6] >>
             (sVar4 & 0x3f) & 1) != 0)) {
          GetHiveKeyValue<int>(&result,(int *)(format.data + sVar4 * 4));
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        else {
          GetHiveKeyNullValue(&result,rhs);
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        Value::operator=(pVVar6,&result);
        Value::~Value(&result);
      }
    }
    break;
  case UINT64:
    UnifiedVectorFormat::UnifiedVectorFormat(&format);
    Vector::ToUnifiedFormat(input,count,&format);
    if ((format.sel)->sel_vector == (uint *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (ulong)*(format.sel)->sel_vector;
    }
    Value::CreateValue<unsigned_long>(&result,*(uint64_t *)(format.data + uVar3 * 8));
    bVar2 = LogicalType::operator!=(&result.type_,rhs);
    Value::~Value(&result);
    if (bVar2) {
      for (sVar7 = 0; count != sVar7; sVar7 = sVar7 + 1) {
        pvVar5 = vector<duckdb::HivePartitionKey,_true>::get<true>(keys,sVar7);
        sVar4 = sVar7;
        if ((format.sel)->sel_vector != (sel_t *)0x0) {
          sVar4 = (size_type)(format.sel)->sel_vector[sVar7];
        }
        if ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[sVar4 >> 6] >>
             (sVar4 & 0x3f) & 1) != 0)) {
          GetHiveKeyValue<unsigned_long>(&result,(unsigned_long *)(format.data + sVar4 * 8));
          LogicalType::LogicalType(&local_48,rhs);
          Value::Reinterpret(&result,&local_48);
          LogicalType::~LogicalType(&local_48);
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        else {
          GetHiveKeyNullValue(&result,rhs);
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        Value::operator=(pVVar6,&result);
        Value::~Value(&result);
      }
    }
    else {
      for (sVar7 = 0; count != sVar7; sVar7 = sVar7 + 1) {
        pvVar5 = vector<duckdb::HivePartitionKey,_true>::get<true>(keys,sVar7);
        sVar4 = sVar7;
        if ((format.sel)->sel_vector != (sel_t *)0x0) {
          sVar4 = (size_type)(format.sel)->sel_vector[sVar7];
        }
        if ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[sVar4 >> 6] >>
             (sVar4 & 0x3f) & 1) != 0)) {
          GetHiveKeyValue<unsigned_long>(&result,(unsigned_long *)(format.data + sVar4 * 8));
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        else {
          GetHiveKeyNullValue(&result,rhs);
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        Value::operator=(pVVar6,&result);
        Value::~Value(&result);
      }
    }
    break;
  case INT64:
    UnifiedVectorFormat::UnifiedVectorFormat(&format);
    Vector::ToUnifiedFormat(input,count,&format);
    if ((format.sel)->sel_vector == (uint *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (ulong)*(format.sel)->sel_vector;
    }
    Value::CreateValue<long>(&result,*(int64_t *)(format.data + uVar3 * 8));
    bVar2 = LogicalType::operator!=(&result.type_,rhs);
    Value::~Value(&result);
    if (bVar2) {
      for (sVar7 = 0; count != sVar7; sVar7 = sVar7 + 1) {
        pvVar5 = vector<duckdb::HivePartitionKey,_true>::get<true>(keys,sVar7);
        sVar4 = sVar7;
        if ((format.sel)->sel_vector != (sel_t *)0x0) {
          sVar4 = (size_type)(format.sel)->sel_vector[sVar7];
        }
        if ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[sVar4 >> 6] >>
             (sVar4 & 0x3f) & 1) != 0)) {
          GetHiveKeyValue<long>(&result,(long *)(format.data + sVar4 * 8));
          LogicalType::LogicalType(&local_48,rhs);
          Value::Reinterpret(&result,&local_48);
          LogicalType::~LogicalType(&local_48);
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        else {
          GetHiveKeyNullValue(&result,rhs);
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        Value::operator=(pVVar6,&result);
        Value::~Value(&result);
      }
    }
    else {
      for (sVar7 = 0; count != sVar7; sVar7 = sVar7 + 1) {
        pvVar5 = vector<duckdb::HivePartitionKey,_true>::get<true>(keys,sVar7);
        sVar4 = sVar7;
        if ((format.sel)->sel_vector != (sel_t *)0x0) {
          sVar4 = (size_type)(format.sel)->sel_vector[sVar7];
        }
        if ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[sVar4 >> 6] >>
             (sVar4 & 0x3f) & 1) != 0)) {
          GetHiveKeyValue<long>(&result,(long *)(format.data + sVar4 * 8));
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        else {
          GetHiveKeyNullValue(&result,rhs);
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        Value::operator=(pVVar6,&result);
        Value::~Value(&result);
      }
    }
    break;
  case UINT64|UINT8:
  case DOUBLE|BOOL:
  case DOUBLE|UINT8:
  case DOUBLE|INT8:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x16:
switchD_017b24b0_caseD_a:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&format,
               "Unsupported type for HivePartitionedColumnData::ComputePartitionIndices",
               (allocator *)&result);
    InternalException::InternalException(this_00,(string *)&format);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    UnifiedVectorFormat::UnifiedVectorFormat(&format);
    Vector::ToUnifiedFormat(input,count,&format);
    if ((format.sel)->sel_vector == (uint *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (ulong)*(format.sel)->sel_vector;
    }
    Value::CreateValue<float>(&result,*(float *)(format.data + uVar3 * 4));
    bVar2 = LogicalType::operator!=(&result.type_,rhs);
    Value::~Value(&result);
    if (bVar2) {
      for (sVar7 = 0; count != sVar7; sVar7 = sVar7 + 1) {
        pvVar5 = vector<duckdb::HivePartitionKey,_true>::get<true>(keys,sVar7);
        sVar4 = sVar7;
        if ((format.sel)->sel_vector != (sel_t *)0x0) {
          sVar4 = (size_type)(format.sel)->sel_vector[sVar7];
        }
        if ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[sVar4 >> 6] >>
             (sVar4 & 0x3f) & 1) != 0)) {
          GetHiveKeyValue<float>(&result,(float *)(format.data + sVar4 * 4));
          LogicalType::LogicalType(&local_48,rhs);
          Value::Reinterpret(&result,&local_48);
          LogicalType::~LogicalType(&local_48);
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        else {
          GetHiveKeyNullValue(&result,rhs);
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        Value::operator=(pVVar6,&result);
        Value::~Value(&result);
      }
    }
    else {
      for (sVar7 = 0; count != sVar7; sVar7 = sVar7 + 1) {
        pvVar5 = vector<duckdb::HivePartitionKey,_true>::get<true>(keys,sVar7);
        sVar4 = sVar7;
        if ((format.sel)->sel_vector != (sel_t *)0x0) {
          sVar4 = (size_type)(format.sel)->sel_vector[sVar7];
        }
        if ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[sVar4 >> 6] >>
             (sVar4 & 0x3f) & 1) != 0)) {
          GetHiveKeyValue<float>(&result,(float *)(format.data + sVar4 * 4));
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        else {
          GetHiveKeyNullValue(&result,rhs);
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        Value::operator=(pVVar6,&result);
        Value::~Value(&result);
      }
    }
    break;
  case DOUBLE:
    UnifiedVectorFormat::UnifiedVectorFormat(&format);
    Vector::ToUnifiedFormat(input,count,&format);
    if ((format.sel)->sel_vector == (uint *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (ulong)*(format.sel)->sel_vector;
    }
    Value::CreateValue<double>(&result,*(double *)(format.data + uVar3 * 8));
    bVar2 = LogicalType::operator!=(&result.type_,rhs);
    Value::~Value(&result);
    if (bVar2) {
      for (sVar7 = 0; count != sVar7; sVar7 = sVar7 + 1) {
        pvVar5 = vector<duckdb::HivePartitionKey,_true>::get<true>(keys,sVar7);
        sVar4 = sVar7;
        if ((format.sel)->sel_vector != (sel_t *)0x0) {
          sVar4 = (size_type)(format.sel)->sel_vector[sVar7];
        }
        if ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[sVar4 >> 6] >>
             (sVar4 & 0x3f) & 1) != 0)) {
          GetHiveKeyValue<double>(&result,(double *)(format.data + sVar4 * 8));
          LogicalType::LogicalType(&local_48,rhs);
          Value::Reinterpret(&result,&local_48);
          LogicalType::~LogicalType(&local_48);
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        else {
          GetHiveKeyNullValue(&result,rhs);
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        Value::operator=(pVVar6,&result);
        Value::~Value(&result);
      }
    }
    else {
      for (sVar7 = 0; count != sVar7; sVar7 = sVar7 + 1) {
        pvVar5 = vector<duckdb::HivePartitionKey,_true>::get<true>(keys,sVar7);
        sVar4 = sVar7;
        if ((format.sel)->sel_vector != (sel_t *)0x0) {
          sVar4 = (size_type)(format.sel)->sel_vector[sVar7];
        }
        if ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[sVar4 >> 6] >>
             (sVar4 & 0x3f) & 1) != 0)) {
          GetHiveKeyValue<double>(&result,(double *)(format.data + sVar4 * 8));
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        else {
          GetHiveKeyNullValue(&result,rhs);
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        Value::operator=(pVVar6,&result);
        Value::~Value(&result);
      }
    }
    break;
  case INTERVAL:
    UnifiedVectorFormat::UnifiedVectorFormat(&format);
    Vector::ToUnifiedFormat(input,count,&format);
    if ((format.sel)->sel_vector == (uint *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (ulong)*(format.sel)->sel_vector;
    }
    value_00.micros = *(int64_t *)(format.data + uVar3 * 0x10 + 8);
    value_00._0_8_ = *(undefined8 *)(format.data + uVar3 * 0x10);
    Value::CreateValue<duckdb::interval_t>(&result,value_00);
    bVar2 = LogicalType::operator!=(&result.type_,rhs);
    Value::~Value(&result);
    if (bVar2) {
      for (sVar7 = 0; count != sVar7; sVar7 = sVar7 + 1) {
        pvVar5 = vector<duckdb::HivePartitionKey,_true>::get<true>(keys,sVar7);
        sVar4 = sVar7;
        if ((format.sel)->sel_vector != (sel_t *)0x0) {
          sVar4 = (size_type)(format.sel)->sel_vector[sVar7];
        }
        if ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[sVar4 >> 6] >>
             (sVar4 & 0x3f) & 1) != 0)) {
          GetHiveKeyValue<duckdb::interval_t>(&result,(interval_t *)(format.data + sVar4 * 0x10));
          LogicalType::LogicalType(&local_48,rhs);
          Value::Reinterpret(&result,&local_48);
          LogicalType::~LogicalType(&local_48);
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        else {
          GetHiveKeyNullValue(&result,rhs);
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        Value::operator=(pVVar6,&result);
        Value::~Value(&result);
      }
    }
    else {
      for (sVar7 = 0; count != sVar7; sVar7 = sVar7 + 1) {
        pvVar5 = vector<duckdb::HivePartitionKey,_true>::get<true>(keys,sVar7);
        sVar4 = sVar7;
        if ((format.sel)->sel_vector != (sel_t *)0x0) {
          sVar4 = (size_type)(format.sel)->sel_vector[sVar7];
        }
        if ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[sVar4 >> 6] >>
             (sVar4 & 0x3f) & 1) != 0)) {
          GetHiveKeyValue<duckdb::interval_t>(&result,(interval_t *)(format.data + sVar4 * 0x10));
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        else {
          GetHiveKeyNullValue(&result,rhs);
          pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
        }
        Value::operator=(pVVar6,&result);
        Value::~Value(&result);
      }
    }
    break;
  case LIST:
  case STRUCT:
    for (sVar7 = 0; count != sVar7; sVar7 = sVar7 + 1) {
      pvVar5 = vector<duckdb::HivePartitionKey,_true>::get<true>(keys,sVar7);
      Vector::GetValue((Value *)&format,input,sVar7);
      this = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
      Value::operator=(this,(Value *)&format);
      Value::~Value((Value *)&format);
    }
    return;
  default:
    if (PVar1 == VARCHAR) {
      UnifiedVectorFormat::UnifiedVectorFormat(&format);
      Vector::ToUnifiedFormat(input,count,&format);
      if ((format.sel)->sel_vector == (uint *)0x0) {
        uVar3 = 0;
      }
      else {
        uVar3 = (ulong)*(format.sel)->sel_vector;
      }
      value.value.pointer.ptr = (char *)format.data;
      value.value._0_8_ = *(undefined8 *)(format.data + uVar3 * 0x10 + 8);
      Value::CreateValue<duckdb::string_t>(&result,*(Value **)(format.data + uVar3 * 0x10),value);
      bVar2 = LogicalType::operator!=(&result.type_,rhs);
      Value::~Value(&result);
      if (bVar2) {
        for (sVar7 = 0; count != sVar7; sVar7 = sVar7 + 1) {
          pvVar5 = vector<duckdb::HivePartitionKey,_true>::get<true>(keys,sVar7);
          sVar4 = sVar7;
          if ((format.sel)->sel_vector != (sel_t *)0x0) {
            sVar4 = (size_type)(format.sel)->sel_vector[sVar7];
          }
          if ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
               (unsigned_long *)0x0) ||
             ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[sVar4 >> 6]
               >> (sVar4 & 0x3f) & 1) != 0)) {
            GetHiveKeyValue<duckdb::string_t>(&result,(string_t *)(format.data + sVar4 * 0x10));
            LogicalType::LogicalType(&local_48,rhs);
            Value::Reinterpret(&result,&local_48);
            LogicalType::~LogicalType(&local_48);
            pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
          }
          else {
            GetHiveKeyNullValue(&result,rhs);
            pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
          }
          Value::operator=(pVVar6,&result);
          Value::~Value(&result);
        }
      }
      else {
        for (sVar7 = 0; count != sVar7; sVar7 = sVar7 + 1) {
          pvVar5 = vector<duckdb::HivePartitionKey,_true>::get<true>(keys,sVar7);
          sVar4 = sVar7;
          if ((format.sel)->sel_vector != (sel_t *)0x0) {
            sVar4 = (size_type)(format.sel)->sel_vector[sVar7];
          }
          if ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
               (unsigned_long *)0x0) ||
             ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[sVar4 >> 6]
               >> (sVar4 & 0x3f) & 1) != 0)) {
            GetHiveKeyValue<duckdb::string_t>(&result,(string_t *)(format.data + sVar4 * 0x10));
            pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
          }
          else {
            GetHiveKeyNullValue(&result,rhs);
            pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
          }
          Value::operator=(pVVar6,&result);
          Value::~Value(&result);
        }
      }
    }
    else if (PVar1 == UINT128) {
      UnifiedVectorFormat::UnifiedVectorFormat(&format);
      Vector::ToUnifiedFormat(input,count,&format);
      if ((format.sel)->sel_vector == (uint *)0x0) {
        uVar3 = 0;
      }
      else {
        uVar3 = (ulong)*(format.sel)->sel_vector;
      }
      value_01.upper = *(uint64_t *)(format.data + uVar3 * 0x10 + 8);
      value_01.lower = *(uint64_t *)(format.data + uVar3 * 0x10);
      Value::CreateValue<duckdb::uhugeint_t>(&result,value_01);
      bVar2 = LogicalType::operator!=(&result.type_,rhs);
      Value::~Value(&result);
      if (bVar2) {
        for (sVar7 = 0; count != sVar7; sVar7 = sVar7 + 1) {
          pvVar5 = vector<duckdb::HivePartitionKey,_true>::get<true>(keys,sVar7);
          sVar4 = sVar7;
          if ((format.sel)->sel_vector != (sel_t *)0x0) {
            sVar4 = (size_type)(format.sel)->sel_vector[sVar7];
          }
          if ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
               (unsigned_long *)0x0) ||
             ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[sVar4 >> 6]
               >> (sVar4 & 0x3f) & 1) != 0)) {
            GetHiveKeyValue<duckdb::uhugeint_t>(&result,(uhugeint_t *)(format.data + sVar4 * 0x10));
            LogicalType::LogicalType(&local_48,rhs);
            Value::Reinterpret(&result,&local_48);
            LogicalType::~LogicalType(&local_48);
            pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
          }
          else {
            GetHiveKeyNullValue(&result,rhs);
            pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
          }
          Value::operator=(pVVar6,&result);
          Value::~Value(&result);
        }
      }
      else {
        for (sVar7 = 0; count != sVar7; sVar7 = sVar7 + 1) {
          pvVar5 = vector<duckdb::HivePartitionKey,_true>::get<true>(keys,sVar7);
          sVar4 = sVar7;
          if ((format.sel)->sel_vector != (sel_t *)0x0) {
            sVar4 = (size_type)(format.sel)->sel_vector[sVar7];
          }
          if ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
               (unsigned_long *)0x0) ||
             ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[sVar4 >> 6]
               >> (sVar4 & 0x3f) & 1) != 0)) {
            GetHiveKeyValue<duckdb::uhugeint_t>(&result,(uhugeint_t *)(format.data + sVar4 * 0x10));
            pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
          }
          else {
            GetHiveKeyNullValue(&result,rhs);
            pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
          }
          Value::operator=(pVVar6,&result);
          Value::~Value(&result);
        }
      }
    }
    else {
      if (PVar1 != INT128) goto switchD_017b24b0_caseD_a;
      UnifiedVectorFormat::UnifiedVectorFormat(&format);
      Vector::ToUnifiedFormat(input,count,&format);
      if ((format.sel)->sel_vector == (uint *)0x0) {
        uVar3 = 0;
      }
      else {
        uVar3 = (ulong)*(format.sel)->sel_vector;
      }
      value_02.upper = *(int64_t *)(format.data + uVar3 * 0x10 + 8);
      value_02.lower = *(uint64_t *)(format.data + uVar3 * 0x10);
      Value::CreateValue<duckdb::hugeint_t>(&result,value_02);
      bVar2 = LogicalType::operator!=(&result.type_,rhs);
      Value::~Value(&result);
      if (bVar2) {
        for (sVar7 = 0; count != sVar7; sVar7 = sVar7 + 1) {
          pvVar5 = vector<duckdb::HivePartitionKey,_true>::get<true>(keys,sVar7);
          sVar4 = sVar7;
          if ((format.sel)->sel_vector != (sel_t *)0x0) {
            sVar4 = (size_type)(format.sel)->sel_vector[sVar7];
          }
          if ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
               (unsigned_long *)0x0) ||
             ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[sVar4 >> 6]
               >> (sVar4 & 0x3f) & 1) != 0)) {
            GetHiveKeyValue<duckdb::hugeint_t>(&result,(hugeint_t *)(format.data + sVar4 * 0x10));
            LogicalType::LogicalType(&local_48,rhs);
            Value::Reinterpret(&result,&local_48);
            LogicalType::~LogicalType(&local_48);
            pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
          }
          else {
            GetHiveKeyNullValue(&result,rhs);
            pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
          }
          Value::operator=(pVVar6,&result);
          Value::~Value(&result);
        }
      }
      else {
        for (sVar7 = 0; count != sVar7; sVar7 = sVar7 + 1) {
          pvVar5 = vector<duckdb::HivePartitionKey,_true>::get<true>(keys,sVar7);
          sVar4 = sVar7;
          if ((format.sel)->sel_vector != (sel_t *)0x0) {
            sVar4 = (size_type)(format.sel)->sel_vector[sVar7];
          }
          if ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
               (unsigned_long *)0x0) ||
             ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[sVar4 >> 6]
               >> (sVar4 & 0x3f) & 1) != 0)) {
            GetHiveKeyValue<duckdb::hugeint_t>(&result,(hugeint_t *)(format.data + sVar4 * 0x10));
            pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
          }
          else {
            GetHiveKeyNullValue(&result,rhs);
            pVVar6 = vector<duckdb::Value,_true>::get<true>(&pvVar5->values,col_idx);
          }
          Value::operator=(pVVar6,&result);
          Value::~Value(&result);
        }
      }
    }
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(&format);
  return;
}

Assistant:

static void GetHivePartitionValuesTypeSwitch(Vector &input, vector<HivePartitionKey> &keys, const idx_t col_idx,
                                             const idx_t count) {
	const auto &type = input.GetType();
	switch (type.InternalType()) {
	case PhysicalType::BOOL:
		TemplatedGetHivePartitionValues<bool>(input, keys, col_idx, count);
		break;
	case PhysicalType::INT8:
		TemplatedGetHivePartitionValues<int8_t>(input, keys, col_idx, count);
		break;
	case PhysicalType::INT16:
		TemplatedGetHivePartitionValues<int16_t>(input, keys, col_idx, count);
		break;
	case PhysicalType::INT32:
		TemplatedGetHivePartitionValues<int32_t>(input, keys, col_idx, count);
		break;
	case PhysicalType::INT64:
		TemplatedGetHivePartitionValues<int64_t>(input, keys, col_idx, count);
		break;
	case PhysicalType::INT128:
		TemplatedGetHivePartitionValues<hugeint_t>(input, keys, col_idx, count);
		break;
	case PhysicalType::UINT8:
		TemplatedGetHivePartitionValues<uint8_t>(input, keys, col_idx, count);
		break;
	case PhysicalType::UINT16:
		TemplatedGetHivePartitionValues<uint16_t>(input, keys, col_idx, count);
		break;
	case PhysicalType::UINT32:
		TemplatedGetHivePartitionValues<uint32_t>(input, keys, col_idx, count);
		break;
	case PhysicalType::UINT64:
		TemplatedGetHivePartitionValues<uint64_t>(input, keys, col_idx, count);
		break;
	case PhysicalType::UINT128:
		TemplatedGetHivePartitionValues<uhugeint_t>(input, keys, col_idx, count);
		break;
	case PhysicalType::FLOAT:
		TemplatedGetHivePartitionValues<float>(input, keys, col_idx, count);
		break;
	case PhysicalType::DOUBLE:
		TemplatedGetHivePartitionValues<double>(input, keys, col_idx, count);
		break;
	case PhysicalType::INTERVAL:
		TemplatedGetHivePartitionValues<interval_t>(input, keys, col_idx, count);
		break;
	case PhysicalType::VARCHAR:
		TemplatedGetHivePartitionValues<string_t>(input, keys, col_idx, count);
		break;
	case PhysicalType::STRUCT:
	case PhysicalType::LIST:
		GetNestedHivePartitionValues(input, keys, col_idx, count);
		break;
	default:
		throw InternalException("Unsupported type for HivePartitionedColumnData::ComputePartitionIndices");
	}
}